

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  float *pfVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  Option *in_RDI;
  bool bVar3;
  float fVar4;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  int wt;
  int val;
  int k;
  char *sptr;
  Mat m_1;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  char *outptr;
  int p;
  size_t out_elemsize;
  bool use_int8_requantize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Option *in_stack_fffffffffffff928;
  float in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  Mat *in_stack_fffffffffffff938;
  Mat *pMVar5;
  Convolution *in_stack_fffffffffffff940;
  void **ppvVar6;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff950;
  int _c;
  int in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  bool local_5d1;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  float local_5a4;
  float local_5a0;
  int local_594;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_570;
  long *local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  int local_53c;
  long local_538;
  int local_52c;
  int local_528;
  int local_524;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined4 local_508;
  long local_500;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined8 local_4e0;
  float *local_4d8;
  int local_4cc;
  ulong local_4c8;
  byte local_4bd;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  reference local_4a8;
  vector<int,_std::allocator<int>_> local_498;
  int local_480;
  int local_47c;
  int local_478;
  undefined4 local_474;
  void *local_470;
  int *local_468;
  long local_460;
  undefined4 local_458;
  long *local_450;
  undefined4 local_448;
  int local_444;
  int local_440;
  undefined4 local_43c;
  int local_438;
  long local_430;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  Mat local_3d0;
  int local_388;
  int local_384;
  long local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_360;
  int local_344;
  void **local_340;
  undefined8 *local_338;
  undefined8 *local_328;
  void **local_318;
  Mat *local_308;
  long *local_2f8;
  void **local_2f0;
  Mat *local_2e0;
  undefined1 local_2d5;
  int local_2d4;
  void **local_2d0;
  undefined8 *local_2c8;
  undefined1 local_2b5;
  int local_2b4;
  undefined8 *local_2a8;
  undefined8 *local_298;
  bool *local_290;
  int local_284;
  undefined8 *local_280;
  undefined8 local_278;
  Option *local_270;
  long local_268;
  bool *local_260;
  long local_258;
  int *local_250;
  undefined8 local_248;
  bool *local_240;
  long local_238;
  int *local_230;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  Allocator **local_200;
  undefined4 local_1f8;
  float local_1f4 [3];
  Allocator **local_1e8;
  undefined8 local_1e0;
  Allocator **local_1d8;
  undefined8 local_1d0;
  Allocator **local_1c8;
  undefined8 local_1c0;
  Allocator **local_1b8;
  undefined8 local_1b0;
  Allocator **local_1a8;
  int local_170;
  undefined4 local_16c;
  Mat *local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  undefined8 *local_128;
  undefined8 *local_108;
  void *local_e0;
  void *local_d0;
  void **local_b0;
  long *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  float *local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long *local_68;
  undefined4 local_5c;
  long local_58;
  void *local_50;
  undefined4 local_44;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_36c = *(int *)((long)in_RSI + 0x2c);
  local_370 = *(int *)(in_RSI + 6);
  local_374 = *(int *)(in_RSI + 7);
  local_380 = in_RSI[2];
  local_384 = *(int *)&in_RDI[3].use_winograd_convolution *
              (*(int *)((long)&in_RDI[3].workspace_allocator + 4) + -1) + 1;
  local_388 = *(int *)&in_RDI[3].use_bf16_storage * (in_RDI[3].openmp_blocktime + -1) + 1;
  local_2e0 = &local_3d0;
  local_3d0.data = (void *)*in_RSI;
  local_3d0.refcount = (int *)in_RSI[1];
  local_3d0.elemsize = in_RSI[2];
  local_3d0.elempack = *(int *)(in_RSI + 3);
  local_3d0.allocator = (Allocator *)in_RSI[4];
  local_3d0.dims = *(int *)(in_RSI + 5);
  local_3d0.w = *(int *)((long)in_RSI + 0x2c);
  local_3d0.h = *(int *)(in_RSI + 6);
  local_3d0.d = *(int *)((long)in_RSI + 0x34);
  local_3d0.c = *(int *)(in_RSI + 7);
  local_3d0.cstep = in_RSI[8];
  if (local_3d0.refcount != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_3d0.refcount;
    *local_3d0.refcount = *local_3d0.refcount + 1;
    UNLOCK();
  }
  local_360 = in_RDX;
  local_8 = local_2e0;
  if (local_380 != 1) {
    local_418 = *in_RCX;
    local_408 = *(undefined4 *)(in_RCX + 2);
    uStack_404 = *(undefined4 *)((long)in_RCX + 0x14);
    uStack_400 = *(undefined4 *)(in_RCX + 3);
    uStack_3fc = *(undefined4 *)((long)in_RCX + 0x1c);
    local_3f8 = in_RCX[4];
    uStack_3f0 = in_RCX[5];
    local_3e8 = in_RCX[6];
    uStack_3e0 = in_RCX[7];
    uStack_410 = in_RCX[2];
    quantize_to_int8((Mat *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),local_2e0,
                     local_2e0,in_RDI);
  }
  local_340 = &local_470;
  local_470 = (void *)0x0;
  local_468 = (int *)0x0;
  local_460 = 0;
  local_458 = 0;
  local_450 = (long *)0x0;
  local_448 = 0;
  local_444 = 0;
  local_440 = 0;
  local_43c = 0;
  local_438 = 0;
  local_430 = 0;
  make_padding(in_stack_fffffffffffff940,in_stack_fffffffffffff938,
               (Mat *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               in_stack_fffffffffffff928);
  local_2f0 = &local_470;
  if (local_470 != (void *)0x0) {
    local_b0 = local_2f0;
  }
  local_5d1 = local_470 != (void *)0x0 && local_430 * local_438 != 0;
  if (local_5d1) {
    local_36c = local_444;
    local_370 = local_440;
    local_478 = (local_444 - local_384) / *(int *)&in_RDI[3].use_int8_packed + 1;
    local_47c = (local_440 - local_388) / *(int *)&in_RDI[3].use_shader_pack8 + 1;
    local_480 = *(int *)((long)&in_RDI[3].workspace_allocator + 4) * in_RDI[3].openmp_blocktime;
    std::allocator<int>::allocator((allocator<int> *)0x247a01);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffff950,
               CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (allocator_type *)in_stack_fffffffffffff940);
    _c = (int)((ulong)in_stack_fffffffffffff950 >> 0x20);
    std::allocator<int>::~allocator((allocator<int> *)0x247a2d);
    local_4a8 = std::vector<int,_std::allocator<int>_>::operator[](&local_498,0);
    local_4ac = 0;
    local_4b0 = 0;
    local_4b4 = local_36c * *(int *)&in_RDI[3].use_bf16_storage -
                *(int *)((long)&in_RDI[3].workspace_allocator + 4) *
                *(int *)&in_RDI[3].use_winograd_convolution;
    for (local_4b8 = 0; local_4b8 < in_RDI[3].openmp_blocktime; local_4b8 = local_4b8 + 1) {
      for (local_4bc = 0; local_4bc < *(int *)((long)&in_RDI[3].workspace_allocator + 4);
          local_4bc = local_4bc + 1) {
        local_4a8[local_4ac] = local_4b0;
        local_4ac = local_4ac + 1;
        local_4b0 = *(int *)&in_RDI[3].use_winograd_convolution + local_4b0;
      }
      local_4b0 = local_4b4 + local_4b0;
    }
    local_4bd = 100 < *(int *)&in_RDI[4].blob_allocator;
    local_4c8 = (ulong)(((byte)~local_4bd & 1) * 3 + 1);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                in_stack_fffffffffffff95c,in_stack_fffffffffffff958,_c,
                CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                (Allocator *)in_stack_fffffffffffff940);
    local_2f8 = local_360;
    bVar3 = true;
    if (*local_360 != 0) {
      local_a8 = local_360;
      bVar3 = local_360[8] * (long)(int)local_360[7] == 0;
    }
    if (bVar3) {
      local_344 = -100;
    }
    else {
      for (local_4cc = 0; local_4cc < *(int *)&in_RDI[3].workspace_allocator;
          local_4cc = local_4cc + 1) {
        local_2a8 = &local_520;
        local_74 = *(int *)((long)local_360 + 0x2c);
        local_78 = (int)local_360[6];
        local_7c = *(undefined4 *)((long)local_360 + 0x34);
        local_4d8 = (float *)(*local_360 + local_360[8] * (long)local_4cc * local_360[2]);
        local_90 = local_360[2];
        local_94 = (undefined4)local_360[3];
        local_a0 = local_360[4];
        local_70 = &local_520;
        local_18 = (long)local_74 * (long)local_78 * local_90;
        local_298 = &local_520;
        local_338 = &local_520;
        local_1c = 0x10;
        local_2b4 = local_4cc;
        local_2b5 = 1;
        local_520 = 0;
        local_510 = 0;
        local_508 = 0;
        local_4f8 = 0;
        local_4f4 = 0;
        local_4f0 = 0;
        local_4ec = 0;
        local_4e8 = 0;
        local_4e0 = 0;
        local_518 = 0;
        local_108 = local_338;
        local_88 = local_4d8;
        local_500 = local_a0;
        for (local_524 = 0; local_524 < local_47c; local_524 = local_524 + 1) {
          for (local_528 = 0; local_528 < local_478; local_528 = local_528 + 1) {
            local_52c = 0;
            local_290 = &in_RDI[5].use_bf16_storage;
            local_538 = *(long *)local_290 + (long)(local_480 * local_374 * local_4cc);
            for (local_53c = 0; local_53c < local_374; local_53c = local_53c + 1) {
              local_2c8 = &local_588;
              local_2d0 = &local_470;
              local_50 = (void *)((long)local_470 + local_430 * local_53c * local_460);
              local_38 = &local_588;
              local_568 = local_450;
              local_28 = (long)local_444 * (long)local_440 * local_460;
              local_2c = 0x10;
              local_44 = local_43c;
              local_58 = local_460;
              local_5c = local_458;
              local_68 = local_450;
              local_2d4 = local_53c;
              local_2d5 = 1;
              local_284 = local_524 * *(int *)&in_RDI[3].use_shader_pack8;
              local_280 = &local_588;
              for (local_594 = 0; local_594 < local_480; local_594 = local_594 + 1) {
                local_52c = (int)*(char *)((long)local_50 +
                                          (long)local_4a8[local_594] +
                                          (long)(local_528 * *(int *)&in_RDI[3].use_int8_packed) +
                                          (long)local_444 * (long)local_284 * local_460) *
                            (int)*(char *)(local_538 + local_594) + local_52c;
              }
              local_538 = local_538 + local_480;
              local_328 = &local_588;
              local_588 = 0;
              local_578 = 0;
              local_570 = 0;
              local_560 = 0;
              local_55c = 0;
              local_558 = 0;
              local_554 = 0;
              local_550 = 0;
              local_548 = 0;
              local_580 = 0;
              local_128 = local_328;
            }
            local_230 = &in_RDI[7].flush_denormals;
            local_238 = (long)local_4cc;
            fVar4 = *(float *)(*(long *)local_230 + local_238 * 4);
            if ((fVar4 != 0.0) || (NAN(fVar4))) {
              local_240 = &in_RDI[8].use_winograd43_convolution;
              local_248 = 0;
              local_250 = &in_RDI[7].flush_denormals;
              local_258 = (long)local_4cc;
              local_5a0 = 1.0 / (**(float **)local_240 *
                                *(float *)(*(long *)local_250 + local_258 * 4));
            }
            else {
              local_5a0 = 0.0;
            }
            local_5a4 = (float)local_52c * local_5a0;
            if (*(int *)(in_RDI + 4) != 0) {
              local_260 = &in_RDI[6].use_shader_pack8;
              local_268 = (long)local_4cc;
              local_5a4 = *(float *)(*(long *)local_260 + local_268 * 4) + local_5a4;
            }
            local_1f8 = *(undefined4 *)((long)&in_RDI[4].blob_allocator + 4);
            local_200 = &in_RDI[4].workspace_allocator;
            local_1f4[0] = local_5a4;
            switch(local_1f8) {
            case 1:
              if (local_5a4 <= 0.0) {
                local_1f4[0] = 0.0;
              }
              break;
            case 2:
              local_1b0 = 0;
              local_204 = *(float *)&(*local_200)->_vptr_Allocator;
              local_1a8 = local_200;
              if (local_5a4 <= 0.0) {
                local_1f4[0] = local_5a4 * local_204;
              }
              break;
            case 3:
              local_1c0 = 0;
              local_208 = *(float *)&(*local_200)->_vptr_Allocator;
              local_1d0 = 1;
              local_20c = *(float *)((long)&(*local_200)->_vptr_Allocator + 4);
              if (local_5a4 < local_208) {
                local_1f4[0] = local_208;
              }
              local_1c8 = local_200;
              local_1b8 = local_200;
              if (local_20c < local_1f4[0]) {
                local_1f4[0] = local_20c;
              }
              break;
            case 4:
              local_210 = 88.37626;
              pfVar2 = std::min<float>(local_1f4,&local_210);
              local_1f4[0] = *pfVar2;
              local_214 = -88.37626;
              pfVar2 = std::max<float>(local_1f4,&local_214);
              local_1f4[0] = *pfVar2;
              fVar4 = expf(-local_1f4[0]);
              local_1f4[0] = 1.0 / (fVar4 + 1.0);
              break;
            case 5:
              fVar4 = expf(local_5a4);
              fVar4 = logf(fVar4 + 1.0);
              local_1f4[0] = tanhf(fVar4);
              local_1f4[0] = local_5a4 * local_1f4[0];
              break;
            case 6:
              local_1e0 = 0;
              local_218 = *(float *)&(*local_200)->_vptr_Allocator;
              local_1f4[1] = 1.4013e-45;
              local_1f4[2] = 0.0;
              local_21c = *(float *)((long)&(*local_200)->_vptr_Allocator + 4);
              local_220 = -local_21c / local_218;
              local_224 = 1.0 / local_218 + local_220;
              local_1e8 = local_200;
              local_1d8 = local_200;
              if (local_220 <= local_5a4) {
                if (local_5a4 <= local_224) {
                  local_1f4[0] = local_5a4 * (local_5a4 * local_218 + local_21c);
                }
              }
              else {
                local_1f4[0] = 0.0;
              }
            }
            if ((local_4bd & 1) == 0) {
              *local_4d8 = local_1f4[0];
              local_4d8 = local_4d8 + 1;
            }
            else {
              local_270 = in_RDI + 10;
              local_278 = 0;
              cVar1 = float2int8(in_stack_fffffffffffff930);
              *(char *)local_4d8 = cVar1;
              local_4d8 = (float *)((long)local_4d8 + 1);
            }
          }
        }
      }
      local_344 = 0;
    }
    local_474 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff940);
  }
  else {
    local_344 = -100;
    local_474 = 1;
  }
  ppvVar6 = &local_470;
  local_318 = ppvVar6;
  local_148 = ppvVar6;
  if (local_468 != (int *)0x0) {
    local_14c = 0xffffffff;
    LOCK();
    local_150 = *local_468;
    *local_468 = *local_468 + -1;
    UNLOCK();
    if (local_150 == 1) {
      if (local_450 == (long *)0x0) {
        local_e0 = local_470;
        if (local_470 != (void *)0x0) {
          free(local_470);
        }
      }
      else {
        (**(code **)(*local_450 + 0x18))(local_450,local_470);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  pMVar5 = &local_3d0;
  if (local_3d0.refcount != (int *)0x0) {
    local_16c = 0xffffffff;
    LOCK();
    local_170 = *local_3d0.refcount;
    *local_3d0.refcount = *local_3d0.refcount + -1;
    UNLOCK();
    if (local_170 == 1) {
      local_308 = pMVar5;
      local_168 = pMVar5;
      if (local_3d0.allocator == (Allocator *)0x0) {
        local_d0 = local_3d0.data;
        if (local_3d0.data != (void *)0x0) {
          free(local_3d0.data);
        }
      }
      else {
        (*(local_3d0.allocator)->_vptr_Allocator[3])(local_3d0.allocator,local_3d0.data);
      }
    }
  }
  pMVar5->data = (void *)0x0;
  pMVar5->elemsize = 0;
  pMVar5->elempack = 0;
  pMVar5->dims = 0;
  pMVar5->w = 0;
  pMVar5->h = 0;
  pMVar5->d = 0;
  pMVar5->c = 0;
  pMVar5->cstep = 0;
  pMVar5->refcount = (int *)0x0;
  return local_344;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}